

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O1

bool __thiscall
mapbox::detail::Earcut<unsigned_int>::isEarHashed(Earcut<unsigned_int> *this,Node *ear)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  Node *pNVar11;
  Node *pNVar12;
  bool bVar13;
  int32_t iVar14;
  int32_t iVar15;
  double *pdVar16;
  double *pdVar17;
  double *pdVar18;
  double *pdVar19;
  double *pdVar20;
  double *pdVar21;
  
  pNVar11 = ear->prev;
  pNVar12 = ear->next;
  dVar5 = ear->x;
  dVar6 = ear->y;
  dVar7 = pNVar11->x;
  dVar8 = pNVar11->y;
  dVar9 = pNVar12->x;
  dVar10 = pNVar12->y;
  if (0.0 <= (dVar9 - dVar5) * (dVar6 - dVar8) - (dVar10 - dVar6) * (dVar5 - dVar7)) {
LAB_0014acfc:
    bVar13 = false;
  }
  else {
    pdVar1 = &pNVar11->y;
    pdVar4 = &pNVar12->x;
    pdVar2 = &ear->x;
    pdVar21 = &pNVar11->x;
    pdVar20 = &pNVar12->y;
    pdVar16 = pdVar2;
    if (dVar9 < dVar5) {
      pdVar16 = pdVar4;
    }
    if (dVar7 < *pdVar16 || dVar7 == *pdVar16) {
      pdVar16 = pdVar21;
    }
    pdVar3 = &ear->y;
    pdVar18 = pdVar3;
    if (dVar10 < dVar6) {
      pdVar18 = pdVar20;
    }
    if (dVar8 < *pdVar18 || dVar8 == *pdVar18) {
      pdVar18 = pdVar1;
    }
    pdVar19 = pdVar2;
    if (dVar5 < dVar9) {
      pdVar19 = pdVar4;
    }
    if (*pdVar19 <= dVar7) {
      pdVar19 = pdVar21;
    }
    pdVar17 = pdVar3;
    if (dVar6 < dVar10) {
      pdVar17 = pdVar20;
    }
    dVar5 = *pdVar19;
    if (*pdVar17 <= dVar8) {
      pdVar17 = pdVar1;
    }
    dVar6 = *pdVar17;
    iVar14 = zOrder(this,*pdVar16,*pdVar18);
    iVar15 = zOrder(this,dVar5,dVar6);
    for (pNVar11 = ear->nextZ; (pNVar11 != (Node *)0x0 && (pNVar11->z <= iVar15));
        pNVar11 = pNVar11->nextZ) {
      if ((pNVar11 != ear->prev) && (pNVar11 != ear->next)) {
        dVar5 = pNVar11->x;
        dVar6 = pNVar11->y;
        if (0.0 <= (*pdVar4 - dVar5) * (*pdVar1 - dVar6) - (*pdVar20 - dVar6) * (*pdVar21 - dVar5))
        {
          if (((0.0 <= (*pdVar21 - dVar5) * (*pdVar3 - dVar6) -
                       (*pdVar1 - dVar6) * (*pdVar2 - dVar5)) &&
              (0.0 <= (*pdVar2 - dVar5) * (*pdVar20 - dVar6) - (*pdVar3 - dVar6) * (*pdVar4 - dVar5)
              )) && (0.0 <= (pNVar11->next->x - dVar5) * (dVar6 - pNVar11->prev->y) -
                            (pNVar11->next->y - dVar6) * (dVar5 - pNVar11->prev->x)))
          goto LAB_0014acfc;
        }
      }
    }
    bVar13 = true;
    for (pNVar11 = ear->prevZ; (pNVar11 != (Node *)0x0 && (iVar14 <= pNVar11->z));
        pNVar11 = pNVar11->prevZ) {
      if ((pNVar11 != ear->prev) && (pNVar11 != ear->next)) {
        dVar5 = pNVar11->x;
        dVar6 = pNVar11->y;
        if (0.0 <= (*pdVar4 - dVar5) * (*pdVar1 - dVar6) - (*pdVar20 - dVar6) * (*pdVar21 - dVar5))
        {
          if (((0.0 <= (*pdVar21 - dVar5) * (*pdVar3 - dVar6) -
                       (*pdVar1 - dVar6) * (*pdVar2 - dVar5)) &&
              (0.0 <= (*pdVar2 - dVar5) * (*pdVar20 - dVar6) - (*pdVar3 - dVar6) * (*pdVar4 - dVar5)
              )) && (0.0 <= (pNVar11->next->x - dVar5) * (dVar6 - pNVar11->prev->y) -
                            (pNVar11->next->y - dVar6) * (dVar5 - pNVar11->prev->x)))
          goto LAB_0014acfc;
        }
      }
    }
  }
  return bVar13;
}

Assistant:

bool Earcut<N>::isEarHashed(Node* ear) {
    const Node* a = ear->prev;
    const Node* b = ear;
    const Node* c = ear->next;

    if (area(a, b, c) >= 0) return false; // reflex, can't be an ear

    // triangle bbox; min & max are calculated like this for speed
    const double minTX = std::min<double>(a->x, std::min<double>(b->x, c->x));
    const double minTY = std::min<double>(a->y, std::min<double>(b->y, c->y));
    const double maxTX = std::max<double>(a->x, std::max<double>(b->x, c->x));
    const double maxTY = std::max<double>(a->y, std::max<double>(b->y, c->y));

    // z-order range for the current triangle bbox;
    const int32_t minZ = zOrder(minTX, minTY);
    const int32_t maxZ = zOrder(maxTX, maxTY);

    // first look for points inside the triangle in increasing z-order
    Node* p = ear->nextZ;

    while (p && p->z <= maxZ) {
        if (p != ear->prev && p != ear->next &&
            pointInTriangle(a->x, a->y, b->x, b->y, c->x, c->y, p->x, p->y) &&
            area(p->prev, p, p->next) >= 0) return false;
        p = p->nextZ;
    }

    // then look for points in decreasing z-order
    p = ear->prevZ;

    while (p && p->z >= minZ) {
        if (p != ear->prev && p != ear->next &&
            pointInTriangle(a->x, a->y, b->x, b->y, c->x, c->y, p->x, p->y) &&
            area(p->prev, p, p->next) >= 0) return false;
        p = p->prevZ;
    }

    return true;
}